

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O0

int __thiscall
vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleConsistency>
::init(MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleConsistency> *this,
      EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_190;
  MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleConsistency> *local_10;
  MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleConsistency> *this_local;
  
  local_10 = this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_MultisampleCaseBase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_190,
                      (char (*) [107])
                      "Verifying that interpolateAtSample with the sample set to the current sampleID returns consistent values.\n"
                     );
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [92])
                             "\tInterpolate varying containing screen space location with centroid and sample qualifiers.\n"
                     );
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [66])
                             "\t=> interpolateAtSample(screenCentroid, sampleID) = screenSample\n");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  iVar1 = tcu::TestNode::init((TestNode *)this,ctx_00);
  return iVar1;
}

Assistant:

void MSCase<MSCaseInterpolateAtSampleConsistency>::init (void)
{
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying that interpolateAtSample with the sample set to the current sampleID returns consistent values.\n"
		<< "	Interpolate varying containing screen space location with centroid and sample qualifiers.\n"
		<< "	=> interpolateAtSample(screenCentroid, sampleID) = screenSample\n"
		<< tcu::TestLog::EndMessage;

	MultisampleCaseBase::init();
}